

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-defs.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::addGlobal
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this)

{
  undefined8 in_stack_00000008;
  char in_stack_00000010;
  
  if (in_stack_00000010 == '\x01') {
    *(undefined8 *)
     ((long)(this->wasm->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[this->index]._M_t.
            super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t + 0x40) =
         in_stack_00000008;
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  return __return_storage_ptr__;
}

Assistant:

Result<> ParseDefsCtx::addGlobal(Name,
                                 const std::vector<Name>&,
                                 ImportNames*,
                                 GlobalTypeT,
                                 std::optional<ExprT> exp,
                                 Index) {
  if (exp) {
    wasm.globals[index]->init = *exp;
  }
  return Ok{};
}